

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

void __thiscall CPU::CPY_ZP(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint8_t res;
  uint8_t op;
  CPU *this_local;
  
  this->cycles = 3;
  bVar1 = GetByte(this);
  bVar1 = ReadByte(this,(ushort)bVar1);
  bVar2 = this->Y - bVar1;
  (this->field_6).ps = (this->field_6).ps & 0xfe | bVar1 <= this->Y;
  (this->field_6).ps = (this->field_6).ps & 0xfd | (this->Y == bVar1) << 1;
  (this->field_6).ps =
       (this->field_6).ps & 0x7f | ((bVar2 & 0x80) != 0 && -1 < (int)(bVar2 & 0x80)) << 7;
  return;
}

Assistant:

void CPU::CPY_ZP()
{
    cycles = 3;
    uint8_t op = ReadByte(GetByte());
    uint8_t res = Y - op;
    C = (Y >= op);
    Z = (Y == op);
    N = (res & 0b10000000) > 0;
}